

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.h
# Opt level: O1

result_type * __thiscall
jbcoin::sha512Half<unsigned_short,unsigned_int>
          (result_type *__return_storage_ptr__,jbcoin *this,unsigned_short *args,uint *args_1)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long lVar3;
  sha512_half_hasher h;
  undefined4 local_fc;
  SHA512_CTX local_f8;
  
  SHA512_Init(&local_f8);
  local_fc = CONCAT22(local_fc._2_2_,*(ushort *)this << 8 | *(ushort *)this >> 8);
  SHA512_Update(&local_f8,&local_fc,2);
  puVar2 = (undefined1 *)((long)&local_fc + 3);
  local_fc = *(undefined4 *)args;
  lVar3 = 0;
  do {
    uVar1 = *(undefined1 *)((long)local_f8.h + lVar3 + -4);
    *(undefined1 *)((long)local_f8.h + lVar3 + -4) = *puVar2;
    *puVar2 = uVar1;
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + -1;
  } while (lVar3 == 1);
  SHA512_Update(&local_f8,&local_fc,4);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (__return_storage_ptr__,(basic_sha512_half_hasher *)&local_f8);
  return __return_storage_ptr__;
}

Assistant:

sha512_half_hasher::result_type
sha512Half (Args const&... args)
{
    sha512_half_hasher h;
    using beast::hash_append;
    hash_append(h, args...);
    return static_cast<typename
        sha512_half_hasher::result_type>(h);
}